

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

void Sim_UtilCountPairsAll(Sym_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  timespec ts;
  timespec local_38;
  
  iVar5 = clock_gettime(3,&local_38);
  if (iVar5 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar9 = 0;
  p->nPairsSymm = 0;
  p->nPairsNonSymm = 0;
  iVar5 = p->nOutputs;
  if (0 < iVar5) {
    iVar6 = 0;
    iVar9 = 0;
    lVar8 = 0;
    do {
      if (((p->vPairsTotal->nSize <= lVar8) || (p->vPairsSym->nSize <= lVar8)) ||
         (p->vPairsNonSym->nSize <= lVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vPairsTotal->pArray[lVar8];
      iVar3 = p->vPairsSym->pArray[lVar8];
      iVar4 = p->vPairsNonSym->pArray[lVar8];
      iVar1 = iVar4 + iVar3;
      if (iVar2 < iVar1) {
        __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                      ,0x29f,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
      }
      if (iVar2 == iVar1) {
        iVar9 = iVar9 + iVar3;
        p->nPairsSymm = iVar9;
        iVar6 = iVar6 + iVar4;
      }
      else {
        if (p->vMatrSymms->nSize <= lVar8) {
LAB_004d18b2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vSupports->nSize <= lVar8) {
LAB_004d1893:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        iVar9 = Sim_UtilCountPairsOne
                          ((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar8],
                           (Vec_Int_t *)p->vSupports->pArray[lVar8]);
        if (p->vMatrNonSymms->nSize <= lVar8) goto LAB_004d18b2;
        if (p->vSupports->nSize <= lVar8) goto LAB_004d1893;
        iVar6 = Sim_UtilCountPairsOne
                          ((Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar8],
                           (Vec_Int_t *)p->vSupports->pArray[lVar8]);
        if (iVar2 < iVar6 + iVar9) {
          __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                        ,0x2a8,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
        }
        if (p->vPairsSym->nSize <= lVar8) {
LAB_004d1874:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vPairsSym->pArray[lVar8] = iVar9;
        if (p->vPairsNonSym->nSize <= lVar8) goto LAB_004d1874;
        p->vPairsNonSym->pArray[lVar8] = iVar6;
        iVar9 = iVar9 + p->nPairsSymm;
        p->nPairsSymm = iVar9;
        iVar6 = iVar6 + p->nPairsNonSymm;
        iVar5 = p->nOutputs;
      }
      p->nPairsNonSymm = iVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
    iVar9 = iVar9 + iVar6;
  }
  p->nPairsRem = p->nPairsTotal - iVar9;
  iVar5 = clock_gettime(3,&local_38);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeCount = p->timeCount + lVar8 + lVar7;
  return;
}

Assistant:

void Sim_UtilCountPairsAll( Sym_Man_t * p )
{
    int nPairsTotal, nPairsSym, nPairsNonSym, i;
    abctime clk;
clk = Abc_Clock();
    p->nPairsSymm    = 0;
    p->nPairsNonSymm = 0;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
        {
            p->nPairsSymm    += nPairsSym;
            p->nPairsNonSymm += nPairsNonSym;
            continue;
        }
        nPairsSym    = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,   i), Vec_VecEntryInt(p->vSupports, i) );
        nPairsNonSym = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i), Vec_VecEntryInt(p->vSupports, i) );
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        Vec_IntWriteEntry( p->vPairsSym,    i, nPairsSym );
        Vec_IntWriteEntry( p->vPairsNonSym, i, nPairsNonSym );
        p->nPairsSymm    += nPairsSym;
        p->nPairsNonSymm += nPairsNonSym;
//        printf( "%d ", nPairsTotal - nPairsSym - nPairsNonSym );
    }
//printf( "\n" );
    p->nPairsRem = p->nPairsTotal-p->nPairsSymm-p->nPairsNonSymm;
p->timeCount += Abc_Clock() - clk;
}